

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

void __thiscall
Centaurus::CharClass<unsigned_char>::append(CharClass<unsigned_char> *this,Range<unsigned_char> *r)

{
  Range<unsigned_char> *__last;
  Range<unsigned_char> *__first;
  size_type __n;
  pointer pRVar1;
  Range<unsigned_char> *pRVar2;
  Range<unsigned_char> *pRVar3;
  long lVar4;
  vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  *this_00;
  
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->m_ranges;
  if (((this->m_ranges).
       super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_start != pRVar1) && (pRVar1[-1].m_end == r->m_start)) {
    pRVar1[-1].m_end = r->m_end;
    return;
  }
  pRVar3 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar3 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pRVar3->_vptr_Range = (_func_int **)&PTR__Range_0017ded0;
    pRVar3->m_start = r->m_start;
    pRVar3->m_end = r->m_end;
    (this->m_ranges).
    super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar3 + 1;
    return;
  }
  __n = std::
        vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
        _M_check_len(this_00,1,"vector::_M_realloc_insert");
  __last = (this->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __first = (this_00->
            super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)pRVar3 - (long)__first;
  pRVar1 = std::
           _Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ::_M_allocate(&this_00->
                          super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                         ,__n);
  *(undefined ***)((long)pRVar1 + lVar4) = &PTR__Range_0017ded0;
  *(uchar *)((long)pRVar1 + lVar4 + 8) = r->m_start;
  *(uchar *)((long)pRVar1 + lVar4 + 9) = r->m_end;
  pRVar2 = std::__uninitialized_copy<false>::
           __uninit_copy<Centaurus::Range<unsigned_char>const*,Centaurus::Range<unsigned_char>*>
                     (__first,pRVar3,pRVar1);
  pRVar3 = std::__uninitialized_copy<false>::
           __uninit_copy<Centaurus::Range<unsigned_char>const*,Centaurus::Range<unsigned_char>*>
                     (pRVar3,__last,pRVar2 + 1);
  std::_Destroy_aux<false>::__destroy<Centaurus::Range<unsigned_char>*>(__first,__last);
  if (__first != (Range<unsigned_char> *)0x0) {
    operator_delete(__first);
  }
  (this_00->
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = pRVar1;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar3;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar1 + __n;
  return;
}

Assistant:

void append(const Range<TCHAR>& r)
    {
        if (m_ranges.empty())
        {
            m_ranges.push_back(r);
        }
        else
        {
            if (m_ranges.back().end() == r.start())
            {
                m_ranges.back().end(r.end());
            }
            else
            {
                m_ranges.push_back(r);
            }
        }
    }